

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

bool __thiscall
glslang::TIntermediate::isFPPromotion(TIntermediate *this,TBasicType from,TBasicType to)

{
  TBasicType to_local;
  TBasicType from_local;
  TIntermediate *this_local;
  
  if ((to == EbtDouble) && ((from | EbtDouble) == EbtFloat16)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TIntermediate::isFPPromotion(TBasicType from, TBasicType to) const
{
    // floating-point promotions
    if (to == EbtDouble) {
        switch(from) {
        case EbtFloat16:
        case EbtFloat:
            return true;
        default:
            break;
        }
    }
    return false;
}